

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

Fl_Color __thiscall Fl_Help_View::get_color(Fl_Help_View *this,char *n,Fl_Color c)

{
  long lVar1;
  int iVar2;
  Fl_Color FVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  uchar g;
  uchar r;
  byte b;
  
  if ((n != (char *)0x0) && (*n != '\0')) {
    if (*n == '#') {
      uVar4 = strtol(n + 1,(char **)0x0,0x10);
      b = (byte)uVar4;
      sVar5 = strlen(n);
      g = (uchar)(uVar4 >> 8);
      if (sVar5 < 5) {
        r = g * '\x11';
        g = ((byte)(uVar4 >> 4) & 0xf) * '\x11';
        b = (b & 0xf) * '\x11';
      }
      else {
        r = (uchar)(uVar4 >> 0x10);
      }
    }
    else {
      lVar1 = 0;
      do {
        lVar6 = lVar1;
        if (lVar6 + 0x18 == 0x1e0) {
          return c;
        }
        iVar2 = strcasecmp(n,*(char **)((long)&get_color::colors[0].name + lVar6));
        lVar1 = lVar6 + 0x18;
      } while (iVar2 != 0);
      r = *(uchar *)((long)&get_color::colors[0].r + lVar6);
      g = *(uchar *)((long)&get_color::colors[0].g + lVar6);
      b = *(byte *)((long)&get_color::colors[0].b + lVar6);
    }
    FVar3 = fl_rgb_color(r,g,b);
    return FVar3;
  }
  return c;
}

Assistant:

Fl_Color				// O - Color value
Fl_Help_View::get_color(const char *n,	// I - Color name
                        Fl_Color   c)	// I - Default color value
{
  int	i;				// Looping var
  int	rgb, r, g, b;			// RGB values
  static const struct {			// Color name table
    const char *name;
    int r, g, b;
  }	colors[] = {
    { "black",		0x00, 0x00, 0x00 },
    { "red",		0xff, 0x00, 0x00 },
    { "green",		0x00, 0x80, 0x00 },
    { "yellow",		0xff, 0xff, 0x00 },
    { "blue",		0x00, 0x00, 0xff },
    { "magenta",	0xff, 0x00, 0xff },
    { "fuchsia",	0xff, 0x00, 0xff },
    { "cyan",		0x00, 0xff, 0xff },
    { "aqua",		0x00, 0xff, 0xff },
    { "white",		0xff, 0xff, 0xff },
    { "gray",		0x80, 0x80, 0x80 },
    { "grey",		0x80, 0x80, 0x80 },
    { "lime",		0x00, 0xff, 0x00 },
    { "maroon",		0x80, 0x00, 0x00 },
    { "navy",		0x00, 0x00, 0x80 },
    { "olive",		0x80, 0x80, 0x00 },
    { "purple",		0x80, 0x00, 0x80 },
    { "silver",		0xc0, 0xc0, 0xc0 },
    { "teal",		0x00, 0x80, 0x80 }
  };


  if (!n || !n[0]) return c;

  if (n[0] == '#') {
    // Do hex color lookup
    rgb = strtol(n + 1, NULL, 16);

    if (strlen(n) > 4) {
      r = rgb >> 16;
      g = (rgb >> 8) & 255;
      b = rgb & 255;
    } else {
      r = (rgb >> 8) * 17;
      g = ((rgb >> 4) & 15) * 17;
      b = (rgb & 15) * 17;
    }
    return (fl_rgb_color((uchar)r, (uchar)g, (uchar)b));
  } else {
    for (i = 0; i < (int)(sizeof(colors) / sizeof(colors[0])); i ++)
      if (!strcasecmp(n, colors[i].name)) {
        return fl_rgb_color(colors[i].r, colors[i].g, colors[i].b);
      }
    return c;
  }
}